

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

bool FIX::Message::InitializeXML(string *url)

{
  DataDictionary *this;
  ConfigError *anon_var_0;
  string *url_local;
  
  this = (DataDictionary *)operator_new(1000);
  DataDictionary::DataDictionary(this,url,false);
  std::unique_ptr<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_>::reset
            ((unique_ptr<FIX::DataDictionary,_std::default_delete<FIX::DataDictionary>_> *)
             &s_dataDictionary,this);
  return true;
}

Assistant:

bool Message::InitializeXML( const std::string& url )
{
  try
  {
    s_dataDictionary.reset(new DataDictionary(url));
    return true;
  }
  catch( ConfigError& )
  { return false; }
}